

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O2

void Gia_Iso2ManCollectOrder
               (Gia_Man_t *pGia,int *pPos,int nPos,Vec_Int_t *vRoots,Vec_Int_t *vVec,Vec_Int_t *vMap
               )

{
  int iVar1;
  int Id;
  Gia_Obj_t *pObj;
  ulong uVar2;
  ulong uVar3;
  
  vRoots->nSize = 0;
  uVar2 = 0;
  uVar3 = (ulong)(uint)nPos;
  if (nPos < 1) {
    uVar3 = uVar2;
  }
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    pObj = Gia_ManPo(pGia,pPos[uVar2]);
    iVar1 = Gia_ObjId(pGia,pObj);
    Vec_IntPush(vRoots,iVar1);
  }
  vVec->nSize = 0;
  Gia_ManIncrementTravId(pGia);
  for (iVar1 = 0; iVar1 < vRoots->nSize; iVar1 = iVar1 + 1) {
    Id = Vec_IntEntry(vRoots,iVar1);
    Gia_Iso2ManCollectOrder_rec(pGia,Id,vRoots,vVec,vMap);
  }
  return;
}

Assistant:

void Gia_Iso2ManCollectOrder( Gia_Man_t * pGia, int * pPos, int nPos, Vec_Int_t * vRoots, Vec_Int_t * vVec, Vec_Int_t * vMap )
{
    int i, iRoot;
    Vec_IntClear( vRoots );
    for ( i = 0; i < nPos; i++ )
        Vec_IntPush( vRoots, Gia_ObjId(pGia, Gia_ManPo(pGia, pPos[i])) );
    Vec_IntClear( vVec );
    Gia_ManIncrementTravId( pGia );
    Vec_IntForEachEntry( vRoots, iRoot, i )
        Gia_Iso2ManCollectOrder_rec( pGia, iRoot, vRoots, vVec, vMap );
}